

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorCircle.cpp
# Opt level: O2

void __thiscall ColorCircle::showUp(ColorCircle *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  bool bVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  if (0 < (this->super_Colored).state_) {
    dVar1 = this->r_;
    dVar12 = (this->super_Colored).hp_ / (this->super_Colored).hp_max_;
    dVar12 = (dVar12 + dVar12) * dVar1 - dVar1;
    dVar1 = dVar1 * dVar1 - dVar12 * dVar12;
    if (dVar1 < 0.0) {
      dVar1 = sqrt(dVar1);
    }
    else {
      dVar1 = SQRT(dVar1);
    }
    dVar13 = Colored::myAtan2(dVar12,-dVar1);
    dVar9 = Colored::myAtan2(dVar12,dVar1);
    bVar8 = dVar9 < dVar13;
    glColor3ub((char)(this->super_Colored).rgb_[0],(char)(this->super_Colored).rgb_[1],
               (char)(this->super_Colored).rgb_[2]);
    glBegin(9);
    for (; dVar2 = (this->super_Colored).shape_scale_,
        dVar13 <= (double)(~-(ulong)bVar8 & (ulong)dVar9 | (ulong)(dVar9 + 360.0) & -(ulong)bVar8);
        dVar13 = dVar13 + 360.0 / (double)this->shape_n_) {
      dVar3 = (this->super_Colored).y_;
      dVar4 = this->r_;
      dVar10 = sin(dVar13 * 0.01745329251993889);
      dVar5 = (this->super_Colored).shape_scale_;
      dVar6 = (this->super_Colored).x_;
      dVar7 = this->r_;
      dVar11 = cos(dVar13 * 0.01745329251993889);
      Colored::myglVertex2d
                (&this->super_Colored,dVar11 * dVar5 * dVar7 + dVar6,dVar2 * dVar4 * dVar10 + dVar3)
      ;
    }
    Colored::myglVertex2d
              (&this->super_Colored,dVar2 * dVar1 + (this->super_Colored).x_,
               dVar2 * dVar12 + (this->super_Colored).y_);
    glEnd();
    glColor3ub(0,0,0);
    glLineWidth((float)(this->super_Colored).line_width_);
    glBegin(1);
    dVar13 = (this->super_Colored).shape_scale_;
    Colored::myglVertex2d
              (&this->super_Colored,-dVar1 * dVar13 + (this->super_Colored).x_,
               dVar13 * dVar12 + (this->super_Colored).y_);
    dVar13 = (this->super_Colored).shape_scale_;
    Colored::myglVertex2d
              (&this->super_Colored,dVar1 * dVar13 + (this->super_Colored).x_,
               dVar13 * dVar12 + (this->super_Colored).y_);
    glEnd();
    return;
  }
  return;
}

Assistant:

void ColorCircle::showUp(){
    if(state_ > 0){
        
        double y_hp = (hp_ / hp_max_) * 2 * r_ - r_;
        double x_hp2 = sqrt(r_ * r_ - y_hp * y_hp);
        double x_hp1 = - x_hp2;
        
        double agl1 = myAtan2(y_hp, x_hp1);
        double agl2 = myAtan2(y_hp, x_hp2);
        if(agl1 > agl2){
            agl2 = agl2 + 360;
        }
        
        glColor3ub(rgb_[0], rgb_[1], rgb_[2]);
        glBegin(GL_POLYGON);
        for(double agl = agl1; agl <= agl2; agl += 360 / ((double)shape_n_) )
        {
            double yy = y_ + shape_scale_ * r_ * sin( agl * DEG2RAD );
            double xx = x_ + shape_scale_ * r_ * cos( agl * DEG2RAD );
            myglVertex2d(xx,yy);
        }
        myglVertex2d(x_ + shape_scale_ * x_hp2, y_ + shape_scale_ * y_hp);
        glEnd();
        
        glColor3ub(0, 0, 0);
        glLineWidth((float)line_width_);
        glBegin(GL_LINES);
        myglVertex2d(x_ + shape_scale_ * x_hp1, y_ + shape_scale_ * y_hp);
        myglVertex2d(x_ + shape_scale_ * x_hp2, y_ + shape_scale_ * y_hp);
        glEnd();
    }
}